

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O0

int format_to_buffer<unsigned_long_long,128ul>(unsigned_long_long Value,char (*Buffer) [128])

{
  undefined1 auVar1 [16];
  char *pcVar2;
  char *pcVar3;
  char *local_28;
  char *CurPtr;
  char *EndPtr;
  char (*Buffer_local) [128];
  unsigned_long_long Value_local;
  
  pcVar2 = std::end<char,128ul>(Buffer);
  local_28 = pcVar2;
  Buffer_local = (char (*) [128])Value;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = Buffer_local;
    pcVar3 = local_28 + -1;
    local_28[-1] = SUB161(auVar1 % ZEXT816(10),0) + '0';
    Buffer_local = (char (*) [128])((ulong)Buffer_local / 10);
    local_28 = pcVar3;
  } while (Buffer_local != (char (*) [128])0x0);
  return (int)pcVar2 - (int)pcVar3;
}

Assistant:

static int format_to_buffer(T Value, char (&Buffer)[N]) {
  char *EndPtr = std::end(Buffer);
  char *CurPtr = EndPtr;

  do {
    *--CurPtr = '0' + char(Value % 10);
    Value /= 10;
  } while (Value);
  return EndPtr - CurPtr;
}